

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeNN.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *__name;
  char **ppcVar5;
  uint uVar6;
  ulong uVar7;
  char deffname [7];
  char defnname [10];
  NaNeuralNetDescr nnd;
  NaConfigPart *conf_list [1];
  char szHidLayNumQuestion [100];
  char prompt [100];
  NaConfigFile nnfile;
  NaNNUnit nnu;
  char local_c60 [8];
  char local_c58 [16];
  char *local_c48;
  NaNeuralNetDescr local_c40 [40];
  uint local_c18;
  uint auStack_c14 [10];
  uint local_bec;
  uint local_be8;
  uint local_be4;
  uint local_be0;
  uint local_bdc;
  uint local_bd8;
  char *local_ba0;
  char local_b98 [112];
  char local_b28 [112];
  NaConfigFile local_ab8 [8];
  undefined1 auStack_ab0 [1168];
  NaNNUnit local_620 [32];
  char local_600 [1488];
  
  builtin_strncpy(local_c60,"new.nn",7);
  builtin_strncpy(local_c58,"Undefined",10);
  reset_rand();
  NaNeuralNetDescr::NaNeuralNetDescr(local_c40,1,1);
  NaConfigFile::NaConfigFile(local_ab8,";NeuCon NeuralNet",1,1,".cna","[ ] ;");
  uVar4 = NaConfigFile::Magic();
  printf("Neural network maker %s\n",uVar4);
  printf("Usage: %s [File.nn [NameOfNN [InDim [InRep [OutDim\n       [OutRep [Feedback [OutAct [HidNum [Hid0 Hid1...]]]]]\n"
         ,*argv);
  if (argc < 2) {
    __name = (char *)ask_user_name("Target filename",local_c60);
    uVar6 = argc - 1;
    ppcVar5 = argv + 1;
  }
  else {
    uVar6 = argc - 2;
    __name = argv[1];
    ppcVar5 = argv + 2;
    printf("Target filename: %s\n",__name);
  }
  NaNNUnit::NaNNUnit(local_620,local_c40);
  local_ba0 = local_600;
  NaConfigFile::AddPartitions((int)auStack_ab0 - 8,(NaConfigPart **)0x1);
  iVar2 = access(__name,0);
  if (iVar2 == 0) {
    printf("Changing NN file \'%s\'\n",__name);
    NaConfigFile::LoadFromFile((char *)local_ab8);
  }
  else {
    printf("Creating new NN file \'%s\'\n",__name);
  }
  if ((int)uVar6 < 1) {
    ask_user_name("Name of NN instance",local_c58);
  }
  else {
    uVar6 = uVar6 - 1;
    pcVar1 = *ppcVar5;
    ppcVar5 = ppcVar5 + 1;
    printf("Name of NN instance: %s\n",pcVar1);
  }
  NaConfigPart::SetInstance(local_600);
  if ((int)uVar6 < 1) {
    local_bec = ask_user_int("Input dimension",local_bec);
  }
  else {
    uVar6 = uVar6 - 1;
    local_bec = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("Input dimension: %d\n",(ulong)local_bec);
  }
  if ((int)uVar6 < 1) {
    local_be8 = ask_user_int("Input repeats",local_be8);
  }
  else {
    uVar6 = uVar6 - 1;
    local_be8 = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("Input repeats: %d\n",(ulong)local_be8);
  }
  if ((int)uVar6 < 1) {
    local_bdc = ask_user_int("Output dimension",local_bdc);
  }
  else {
    uVar6 = uVar6 - 1;
    local_bdc = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("Output dimension: %d\n",(ulong)local_bdc);
  }
  if ((int)uVar6 < 1) {
    local_be4 = ask_user_int("Output repeats",local_be4);
  }
  else {
    uVar6 = uVar6 - 1;
    local_be4 = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("Output repeats: %d\n",(ulong)local_be4);
  }
  if ((int)uVar6 < 1) {
    local_be0 = ask_user_int("Feedback depth",local_be0);
  }
  else {
    uVar6 = uVar6 - 1;
    local_be0 = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("Feedback depth: %d\n",(ulong)local_be0);
  }
  if ((int)uVar6 < 1) {
    local_bd8 = ask_user_int("Output activation (0-linear; 1-sigmoid)",local_bd8);
  }
  else {
    uVar6 = uVar6 - 1;
    local_bd8 = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("Output activation (0-linear; 1-sigmoid): %d\n",(ulong)local_bd8);
  }
  sprintf(local_b98,"Number of hidden layers (0-%u)",10);
  if ((int)uVar6 < 1) {
    local_c18 = ask_user_int(local_b98,local_c18);
  }
  else {
    uVar6 = uVar6 - 1;
    local_c18 = atoi(*ppcVar5);
    ppcVar5 = ppcVar5 + 1;
    printf("%s: %u\n",local_b98,(ulong)local_c18);
  }
  local_c48 = __name;
  if (10 < local_c18) {
    printf("Not more than %u layers are allowed.\n",10);
    local_c18 = 10;
  }
  if (local_c18 != 0) {
    uVar7 = 0;
    do {
      if (uVar7 < uVar6) {
        uVar3 = atoi(ppcVar5[uVar7]);
        auStack_c14[uVar7] = uVar3;
        printf("Hidden layer #%u: %d\n",uVar7 & 0xffffffff,(ulong)uVar3);
      }
      else {
        sprintf(local_b28,"Hidden layer #%u",uVar7 & 0xffffffff);
        uVar3 = ask_user_int(local_b28,auStack_c14[uVar7]);
        auStack_c14[uVar7] = uVar3;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_c18);
  }
  NaNNUnit::AssignDescr((NaNeuralNetDescr *)local_620);
  NaNNUnit::Initialize();
  NaConfigFile::SaveToFile((char *)local_ab8);
  NaNNUnit::~NaNNUnit(local_620);
  NaConfigFile::~NaConfigFile(local_ab8);
  NaNeuralNetDescr::~NaNeuralNetDescr(local_c40);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int     argn = argc - 1;
  char    **args = argv + 1;
  char    *fname, deffname[] = "new.nn";
  char    *nname, defnname[] = "Undefined";

  reset_rand();

  try{
    NaNeuralNetDescr    nnd;    // Default NN description 
    NaConfigFile        nnfile(";NeuCon NeuralNet", 1, 1);

    printf("Neural network maker %s\n", nnfile.Magic());
    printf("Usage: %s [File.nn [NameOfNN [InDim [InRep [OutDim\n"
	   "       [OutRep [Feedback [OutAct [HidNum [Hid0 Hid1...]]]]]\n",
	   argv[0]);

    if(argn > 0)
      {
	--argn;		/* used argument */
	fname = args[0];  ++args;
	printf("Target filename: %s\n", fname);
      }
    else
      fname = ask_user_name("Target filename", deffname);

    // Some default NN description
    NaNNUnit            nnu(nnd);

    NaConfigPart        *conf_list[] = { &nnu };
    nnfile.AddPartitions(NaNUMBER(conf_list), conf_list);

    // Check for existant file
    if(!access(fname, F_OK)){
        // File is exist
        printf("Changing NN file '%s'\n", fname);

        // Read neural network from file
        nnfile.LoadFromFile(fname);
    }else{
        // New file
        printf("Creating new NN file '%s'\n", fname);
    }

    if(argn > 0)
      {
	--argn;		/* used argument */
	nname = args[0];  ++args;
	printf("Name of NN instance: %s\n", nname);
      }
    else
      nname = ask_user_name("Name of NN instance", defnname);

    nnu.SetInstance(nname);

    // Ask for NN description
    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nInputsNumber = atoi(args[0]);  ++args;
	printf("Input dimension: %d\n", nnd.nInputsNumber);
      }
    else
      nnd.nInputsNumber = ask_user_int("Input dimension",
				       nnd.nInputsNumber);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nInputsRepeat = atoi(args[0]);  ++args;
	printf("Input repeats: %d\n", nnd.nInputsRepeat);
      }
    else
      nnd.nInputsRepeat = ask_user_int("Input repeats",
				       nnd.nInputsRepeat);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nOutNeurons = atoi(args[0]);  ++args;
	printf("Output dimension: %d\n", nnd.nOutNeurons);
      }
    else
      nnd.nOutNeurons = ask_user_int("Output dimension",
				     nnd.nOutNeurons);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nOutputsRepeat = atoi(args[0]);  ++args;
	printf("Output repeats: %d\n", nnd.nOutputsRepeat);
      }
    else
      nnd.nOutputsRepeat = ask_user_int("Output repeats",
					nnd.nOutputsRepeat);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nFeedbackDepth = atoi(args[0]);  ++args;
	printf("Feedback depth: %d\n", nnd.nFeedbackDepth);
      }
    else
      nnd.nFeedbackDepth = ask_user_int("Feedback depth",
					nnd.nFeedbackDepth);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.eLastActFunc = (NaActFuncKind) atoi(args[0]);  ++args;
	printf("Output activation (0-linear; 1-sigmoid): %d\n",
	       nnd.eLastActFunc);
      }
    else
      nnd.eLastActFunc =
        (NaActFuncKind) ask_user_int("Output activation (0-linear; 1-sigmoid)",
				     nnd.eLastActFunc);

    char szHidLayNumQuestion[100];
    sprintf(szHidLayNumQuestion, "Number of hidden layers (0-%u)", NaMAX_HIDDEN);
    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nHidLayers = atoi(args[0]);  ++args;
	printf("%s: %u\n", szHidLayNumQuestion, nnd.nHidLayers);
      }
    else
      nnd.nHidLayers = ask_user_int(szHidLayNumQuestion, nnd.nHidLayers);

    if(nnd.nHidLayers > NaMAX_HIDDEN){
        printf("Not more than %u layers are allowed.\n", NaMAX_HIDDEN);
        nnd.nHidLayers = NaMAX_HIDDEN;
    }

    unsigned    iLayer;
    for(iLayer = 0; iLayer < nnd.nHidLayers; ++iLayer){
        // Ask for number of neurons in given layer
	if(argn > iLayer)
	  {
	    nnd.nHidNeurons[iLayer] = atoi(args[iLayer]);
	    printf("Hidden layer #%u: %d\n", iLayer, nnd.nHidNeurons[iLayer]);
	  }
	else
	  {
	    char    prompt[100];
	    sprintf(prompt, "Hidden layer #%u", iLayer);
	    nnd.nHidNeurons[iLayer] = ask_user_int(prompt,
						   nnd.nHidNeurons[iLayer]);
	  }
    }

    nnu.AssignDescr(nnd);

    nnu.Initialize();

    // Store neural network to file
    nnfile.SaveToFile(fname);
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}